

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_variant.h
# Opt level: O0

bool __thiscall BamTools::Variant::is_type<float>(Variant *this)

{
  bool bVar1;
  type_info *in_RDI;
  type_info *unaff_retaddr;
  
  if (*(long *)in_RDI == 0) {
    __cxa_bad_typeid();
  }
  bVar1 = std::type_info::operator==(unaff_retaddr,in_RDI);
  return bVar1;
}

Assistant:

bool is_type() const
    {
        return typeid(*data) == typeid(Impl<T>);
    }